

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Index __thiscall wabt::Module::GetFuncTypeIndex(Module *this,FuncSignature *sig)

{
  pointer ppFVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  ppFVar1 = (this->func_types).
            super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar3 = (long)(this->func_types).
                super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppFVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    do {
      bVar2 = FuncSignature::operator==(&ppFVar1[lVar4]->sig,sig);
      if (bVar2) {
        return (Index)lVar4;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return 0xffffffff;
}

Assistant:

Index Module::GetFuncTypeIndex(const FuncSignature& sig) const {
  for (size_t i = 0; i < func_types.size(); ++i) {
    if (func_types[i]->sig == sig) {
      return i;
    }
  }
  return kInvalidIndex;
}